

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecHelper.cpp
# Opt level: O3

char typeCharacter(DataType type)

{
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    return 's';
  case HELICS_DOUBLE:
    return 'd';
  case HELICS_INT:
    return 'i';
  case HELICS_COMPLEX:
    return 'c';
  case HELICS_VECTOR:
    return 'v';
  case HELICS_COMPLEX_VECTOR:
  case HELICS_NAMED_POINT:
  case HELICS_BOOL:
  case HELICS_TIME:
    goto switchD_001b95d0_caseD_5;
  default:
    if (type == HELICS_ANY) {
      return 'a';
    }
switchD_001b95d0_caseD_5:
    return 'u';
  }
}

Assistant:

char typeCharacter(DataType type)
{
    switch (type) {
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return 's';
        case DataType::HELICS_DOUBLE:
            return 'd';
        case DataType::HELICS_INT:
            return 'i';
        case DataType::HELICS_COMPLEX:
            return 'c';
        case DataType::HELICS_VECTOR:
            return 'v';
        case DataType::HELICS_ANY:
            return 'a';
        case DataType::HELICS_CUSTOM:
        default:
            return 'u';
    }
}